

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_4ec2e9::BNTest_ExpZeroModOne_Test::TestBody(BNTest_ExpZeroModOne_Test *this)

{
  _Head_base<0UL,_bignum_st_*,_false> _Var1;
  _Head_base<0UL,_bignum_st_*,_false> _Var2;
  _Head_base<0UL,_bignum_st_*,_false> a_00;
  int iVar3;
  BIGNUM *pBVar4;
  char *in_R9;
  char *pcVar5;
  UniquePtr<BIGNUM> r;
  UniquePtr<BIGNUM> zero;
  UniquePtr<BIGNUM> a;
  UniquePtr<BIGNUM> minus_one;
  AssertHelper local_80;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_78;
  internal local_70 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_68;
  string local_60;
  _Head_base<0UL,_bignum_st_*,_false> local_40;
  _Head_base<0UL,_bignum_st_*,_false> local_38;
  _Head_base<0UL,_bignum_st_*,_false> local_30;
  unique_ptr<bignum_st,_bssl::internal::Deleter> local_28;
  
  local_38._M_head_impl = (bignum_st *)BN_new();
  local_30._M_head_impl = (bignum_st *)BN_new();
  local_40._M_head_impl = (bignum_st *)BN_new();
  local_28._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl =
       (__uniq_ptr_data<bignum_st,_bssl::internal::Deleter,_true,_true>)BN_new();
  local_70[0] = (internal)((BIGNUM *)local_38._M_head_impl != (BIGNUM *)0x0);
  local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((BIGNUM *)local_38._M_head_impl == (BIGNUM *)0x0) {
    testing::Message::Message((Message *)&local_78);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_60,local_70,(AssertionResult *)0x5120f6,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
               ,0x63f,local_60._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_78);
  }
  else {
    local_70[0] = (internal)((BIGNUM *)local_30._M_head_impl != (BIGNUM *)0x0);
    local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if ((BIGNUM *)local_30._M_head_impl == (BIGNUM *)0x0) {
      testing::Message::Message((Message *)&local_78);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_60,local_70,(AssertionResult *)(anon_var_dwarf_1aa588 + 0xc),"false","true",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_80,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                 ,0x640,local_60._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_78);
    }
    else {
      local_70[0] = (internal)((BIGNUM *)local_40._M_head_impl != (BIGNUM *)0x0);
      local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if ((BIGNUM *)local_40._M_head_impl == (BIGNUM *)0x0) {
        testing::Message::Message((Message *)&local_78);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_60,local_70,(AssertionResult *)0x592b19,"false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_80,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                   ,0x641,local_60._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_78);
      }
      else {
        local_70[0] = (internal)
                      ((tuple<bignum_st_*,_bssl::internal::Deleter>)
                       local_28._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl !=
                      (_Head_base<0UL,_bignum_st_*,_false>)0x0);
        local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if ((tuple<bignum_st_*,_bssl::internal::Deleter>)
            local_28._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
            super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl ==
            (_Head_base<0UL,_bignum_st_*,_false>)0x0) {
          testing::Message::Message((Message *)&local_78);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_60,local_70,(AssertionResult *)0x547889,"false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_80,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                     ,0x642,local_60._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_78);
        }
        else {
          iVar3 = BN_set_word((BIGNUM *)
                              local_28._M_t.
                              super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                              super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                              super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,1);
          local_70[0] = (internal)(iVar3 != 0);
          local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (iVar3 == 0) {
            testing::Message::Message((Message *)&local_78);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      (&local_60,local_70,(AssertionResult *)"BN_set_word(minus_one.get(), 1)",
                       "false","true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_80,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                       ,0x643,local_60._M_dataplus._M_p);
            testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_78);
          }
          else {
            BN_set_negative((BIGNUM *)
                            local_28._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>.
                            _M_t.super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,1);
            iVar3 = BN_rand((BIGNUM *)local_30._M_head_impl,0x400,0,0);
            local_70[0] = (internal)(iVar3 != 0);
            local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            if (iVar3 == 0) {
              testing::Message::Message((Message *)&local_78);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        (&local_60,local_70,(AssertionResult *)"BN_rand(a.get(), 1024, 0, 0)",
                         "false","true",in_R9);
              testing::internal::AssertHelper::AssertHelper
                        (&local_80,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                         ,0x645,local_60._M_dataplus._M_p);
              testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_78);
            }
            else {
              BN_zero(local_38._M_head_impl);
              a_00._M_head_impl = local_30._M_head_impl;
              _Var2._M_head_impl = local_38._M_head_impl;
              _Var1._M_head_impl = local_40._M_head_impl;
              pBVar4 = BN_value_one();
              iVar3 = BN_mod_exp((BIGNUM *)_Var1._M_head_impl,(BIGNUM *)a_00._M_head_impl,
                                 (BIGNUM *)_Var2._M_head_impl,pBVar4,
                                 (BN_CTX *)
                                 (this->super_BNTest).ctx_._M_t.
                                 super___uniq_ptr_impl<bignum_ctx,_bssl::internal::Deleter>._M_t.
                                 super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
                                 super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl);
              local_70[0] = (internal)(iVar3 != 0);
              local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              if (iVar3 == 0) {
                testing::Message::Message((Message *)&local_78);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          (&local_60,local_70,
                           (AssertionResult *)
                           "BN_mod_exp(r.get(), a.get(), zero.get(), BN_value_one(), ctx())","false"
                           ,"true",in_R9);
                testing::internal::AssertHelper::AssertHelper
                          (&local_80,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                           ,0x648,local_60._M_dataplus._M_p);
                testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_78);
              }
              else {
                iVar3 = BN_is_zero(local_40._M_head_impl);
                local_70[0] = (internal)(iVar3 != 0);
                local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
                if (!(bool)local_70[0]) {
                  testing::Message::Message((Message *)&local_78);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            (&local_60,local_70,(AssertionResult *)"BN_is_zero(r.get())","false",
                             "true",in_R9);
                  testing::internal::AssertHelper::AssertHelper
                            (&local_80,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                             ,0x649,local_60._M_dataplus._M_p);
                  testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_78);
                  testing::internal::AssertHelper::~AssertHelper(&local_80);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_60._M_dataplus._M_p != &local_60.field_2) {
                    operator_delete(local_60._M_dataplus._M_p,
                                    local_60.field_2._M_allocated_capacity + 1);
                  }
                  if (local_78._M_head_impl !=
                      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                     ) {
                    (**(code **)(*(long *)local_78._M_head_impl + 8))();
                  }
                  if (local_68 !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    std::
                    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&local_68,local_68);
                  }
                }
                _Var2._M_head_impl = local_38._M_head_impl;
                _Var1._M_head_impl = local_40._M_head_impl;
                pBVar4 = BN_value_one();
                iVar3 = BN_mod_exp((BIGNUM *)_Var1._M_head_impl,(BIGNUM *)_Var2._M_head_impl,
                                   (BIGNUM *)_Var2._M_head_impl,pBVar4,
                                   (BN_CTX *)
                                   (this->super_BNTest).ctx_._M_t.
                                   super___uniq_ptr_impl<bignum_ctx,_bssl::internal::Deleter>._M_t.
                                   super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
                                   super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl);
                local_70[0] = (internal)(iVar3 != 0);
                local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
                if (iVar3 == 0) {
                  testing::Message::Message((Message *)&local_78);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            (&local_60,local_70,
                             (AssertionResult *)
                             "BN_mod_exp(r.get(), zero.get(), zero.get(), BN_value_one(), ctx())",
                             "false","true",in_R9);
                  testing::internal::AssertHelper::AssertHelper
                            (&local_80,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                             ,0x64b,local_60._M_dataplus._M_p);
                  testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_78);
                }
                else {
                  iVar3 = BN_is_zero(local_40._M_head_impl);
                  local_70[0] = (internal)(iVar3 != 0);
                  local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x0;
                  if (!(bool)local_70[0]) {
                    testing::Message::Message((Message *)&local_78);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              (&local_60,local_70,(AssertionResult *)"BN_is_zero(r.get())","false",
                               "true",in_R9);
                    testing::internal::AssertHelper::AssertHelper
                              (&local_80,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                               ,0x64c,local_60._M_dataplus._M_p);
                    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_78);
                    testing::internal::AssertHelper::~AssertHelper(&local_80);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_60._M_dataplus._M_p != &local_60.field_2) {
                      operator_delete(local_60._M_dataplus._M_p,
                                      local_60.field_2._M_allocated_capacity + 1);
                    }
                    if (local_78._M_head_impl !=
                        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x0) {
                      (**(code **)(*(long *)local_78._M_head_impl + 8))();
                    }
                    if (local_68 !=
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      std::
                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)&local_68,local_68);
                    }
                  }
                  _Var2._M_head_impl = local_38._M_head_impl;
                  _Var1._M_head_impl = local_40._M_head_impl;
                  pBVar4 = BN_value_one();
                  pcVar5 = (char *)0x0;
                  iVar3 = BN_mod_exp_mont_word
                                    ((BIGNUM *)_Var1._M_head_impl,0x2a,(BIGNUM *)_Var2._M_head_impl,
                                     pBVar4,(BN_CTX *)
                                            (this->super_BNTest).ctx_._M_t.
                                            super___uniq_ptr_impl<bignum_ctx,_bssl::internal::Deleter>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>
                                            .super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl
                                     ,(BN_MONT_CTX *)0x0);
                  local_70[0] = (internal)(iVar3 != 0);
                  local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x0;
                  if (iVar3 == 0) {
                    testing::Message::Message((Message *)&local_78);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              (&local_60,local_70,
                               (AssertionResult *)
                               "BN_mod_exp_mont_word(r.get(), 42, zero.get(), BN_value_one(), ctx(), nullptr)"
                               ,"false","true",pcVar5);
                    testing::internal::AssertHelper::AssertHelper
                              (&local_80,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                               ,0x64f,local_60._M_dataplus._M_p);
                    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_78);
                  }
                  else {
                    iVar3 = BN_is_zero(local_40._M_head_impl);
                    local_70[0] = (internal)(iVar3 != 0);
                    local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               0x0;
                    if (!(bool)local_70[0]) {
                      testing::Message::Message((Message *)&local_78);
                      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                (&local_60,local_70,(AssertionResult *)"BN_is_zero(r.get())","false"
                                 ,"true",pcVar5);
                      testing::internal::AssertHelper::AssertHelper
                                (&local_80,kNonFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                 ,0x650,local_60._M_dataplus._M_p);
                      testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_78);
                      testing::internal::AssertHelper::~AssertHelper(&local_80);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_60._M_dataplus._M_p != &local_60.field_2) {
                        operator_delete(local_60._M_dataplus._M_p,
                                        local_60.field_2._M_allocated_capacity + 1);
                      }
                      if (local_78._M_head_impl !=
                          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *
                          )0x0) {
                        (**(code **)(*(long *)local_78._M_head_impl + 8))();
                      }
                      if (local_68 !=
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                      {
                        std::
                        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)&local_68,local_68);
                      }
                    }
                    _Var2._M_head_impl = local_38._M_head_impl;
                    _Var1._M_head_impl = local_40._M_head_impl;
                    pBVar4 = BN_value_one();
                    pcVar5 = (char *)0x0;
                    iVar3 = BN_mod_exp_mont_word
                                      ((BIGNUM *)_Var1._M_head_impl,0,(BIGNUM *)_Var2._M_head_impl,
                                       pBVar4,(BN_CTX *)
                                              (this->super_BNTest).ctx_._M_t.
                                              super___uniq_ptr_impl<bignum_ctx,_bssl::internal::Deleter>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>
                                              .super__Head_base<0UL,_bignum_ctx_*,_false>.
                                              _M_head_impl,(BN_MONT_CTX *)0x0);
                    local_70[0] = (internal)(iVar3 != 0);
                    local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               0x0;
                    if (iVar3 == 0) {
                      testing::Message::Message((Message *)&local_78);
                      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                (&local_60,local_70,
                                 (AssertionResult *)
                                 "BN_mod_exp_mont_word(r.get(), 0, zero.get(), BN_value_one(), ctx(), nullptr)"
                                 ,"false","true",pcVar5);
                      testing::internal::AssertHelper::AssertHelper
                                (&local_80,kFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                 ,0x652,local_60._M_dataplus._M_p);
                      testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_78);
                    }
                    else {
                      iVar3 = BN_is_zero(local_40._M_head_impl);
                      local_70[0] = (internal)(iVar3 != 0);
                      local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)0x0;
                      if (!(bool)local_70[0]) {
                        testing::Message::Message((Message *)&local_78);
                        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                  (&local_60,local_70,(AssertionResult *)"BN_is_zero(r.get())",
                                   "false","true",pcVar5);
                        testing::internal::AssertHelper::AssertHelper
                                  (&local_80,kNonFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                   ,0x653,local_60._M_dataplus._M_p);
                        testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_78);
                        testing::internal::AssertHelper::~AssertHelper(&local_80);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_60._M_dataplus._M_p != &local_60.field_2) {
                          operator_delete(local_60._M_dataplus._M_p,
                                          local_60.field_2._M_allocated_capacity + 1);
                        }
                        if (local_78._M_head_impl !=
                            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                             *)0x0) {
                          (**(code **)(*(long *)local_78._M_head_impl + 8))();
                        }
                        if (local_68 !=
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                           ) {
                          std::
                          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&local_68,local_68);
                        }
                      }
                      _Var2._M_head_impl = local_38._M_head_impl;
                      _Var1._M_head_impl = local_40._M_head_impl;
                      pBVar4 = BN_value_one();
                      pcVar5 = (char *)0x0;
                      iVar3 = BN_mod_exp_mont((BIGNUM *)_Var1._M_head_impl,
                                              (BIGNUM *)_Var2._M_head_impl,
                                              (BIGNUM *)_Var2._M_head_impl,pBVar4,
                                              (BN_CTX *)
                                              (this->super_BNTest).ctx_._M_t.
                                              super___uniq_ptr_impl<bignum_ctx,_bssl::internal::Deleter>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>
                                              .super__Head_base<0UL,_bignum_ctx_*,_false>.
                                              _M_head_impl,(BN_MONT_CTX *)0x0);
                      local_70[0] = (internal)(iVar3 != 0);
                      local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)0x0;
                      if (iVar3 == 0) {
                        testing::Message::Message((Message *)&local_78);
                        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                  (&local_60,local_70,
                                   (AssertionResult *)
                                   "BN_mod_exp_mont(r.get(), zero.get(), zero.get(), BN_value_one(), ctx(), nullptr)"
                                   ,"false","true",pcVar5);
                        testing::internal::AssertHelper::AssertHelper
                                  (&local_80,kFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                   ,0x658,local_60._M_dataplus._M_p);
                        testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_78);
                      }
                      else {
                        iVar3 = BN_is_zero(local_40._M_head_impl);
                        local_70[0] = (internal)(iVar3 != 0);
                        local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)0x0;
                        if (!(bool)local_70[0]) {
                          testing::Message::Message((Message *)&local_78);
                          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                    (&local_60,local_70,(AssertionResult *)"BN_is_zero(r.get())",
                                     "false","true",pcVar5);
                          testing::internal::AssertHelper::AssertHelper
                                    (&local_80,kNonFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                     ,0x659,local_60._M_dataplus._M_p);
                          testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_78)
                          ;
                          testing::internal::AssertHelper::~AssertHelper(&local_80);
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_60._M_dataplus._M_p != &local_60.field_2) {
                            operator_delete(local_60._M_dataplus._M_p,
                                            local_60.field_2._M_allocated_capacity + 1);
                          }
                          if (local_78._M_head_impl !=
                              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                               *)0x0) {
                            (**(code **)(*(long *)local_78._M_head_impl + 8))();
                          }
                          if (local_68 !=
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x0) {
                            std::
                            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)&local_68,local_68);
                          }
                        }
                        _Var2._M_head_impl = local_38._M_head_impl;
                        _Var1._M_head_impl = local_40._M_head_impl;
                        pBVar4 = BN_value_one();
                        pcVar5 = (char *)0x0;
                        iVar3 = BN_mod_exp_mont_consttime
                                          ((BIGNUM *)_Var1._M_head_impl,(BIGNUM *)_Var2._M_head_impl
                                           ,(BIGNUM *)_Var2._M_head_impl,pBVar4,
                                           (BN_CTX *)
                                           (this->super_BNTest).ctx_._M_t.
                                           super___uniq_ptr_impl<bignum_ctx,_bssl::internal::Deleter>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>
                                           .super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl,
                                           (BN_MONT_CTX *)0x0);
                        local_70[0] = (internal)(iVar3 != 0);
                        local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)0x0;
                        if (iVar3 == 0) {
                          testing::Message::Message((Message *)&local_78);
                          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                    (&local_60,local_70,
                                     (AssertionResult *)
                                     "BN_mod_exp_mont_consttime(r.get(), zero.get(), zero.get(), BN_value_one(), ctx(), nullptr)"
                                     ,"false","true",pcVar5);
                          testing::internal::AssertHelper::AssertHelper
                                    (&local_80,kFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                     ,0x65c,local_60._M_dataplus._M_p);
                          testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_78)
                          ;
                        }
                        else {
                          iVar3 = BN_is_zero(local_40._M_head_impl);
                          local_70[0] = (internal)(iVar3 != 0);
                          local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)0x0;
                          if ((bool)local_70[0]) goto LAB_002b6515;
                          testing::Message::Message((Message *)&local_78);
                          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                    (&local_60,local_70,(AssertionResult *)"BN_is_zero(r.get())",
                                     "false","true",pcVar5);
                          testing::internal::AssertHelper::AssertHelper
                                    (&local_80,kNonFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                     ,0x65d,local_60._M_dataplus._M_p);
                          testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_78)
                          ;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  testing::internal::AssertHelper::~AssertHelper(&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if (local_78._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_78._M_head_impl + 8))();
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
LAB_002b6515:
  std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr(&local_28);
  std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&local_40);
  std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&local_30);
  std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&local_38);
  return;
}

Assistant:

TEST_F(BNTest, ExpZeroModOne) {
  bssl::UniquePtr<BIGNUM> zero(BN_new()), a(BN_new()), r(BN_new()),
      minus_one(BN_new());
  ASSERT_TRUE(zero);
  ASSERT_TRUE(a);
  ASSERT_TRUE(r);
  ASSERT_TRUE(minus_one);
  ASSERT_TRUE(BN_set_word(minus_one.get(), 1));
  BN_set_negative(minus_one.get(), 1);
  ASSERT_TRUE(BN_rand(a.get(), 1024, BN_RAND_TOP_ONE, BN_RAND_BOTTOM_ANY));
  BN_zero(zero.get());

  ASSERT_TRUE(BN_mod_exp(r.get(), a.get(), zero.get(), BN_value_one(), ctx()));
  EXPECT_TRUE(BN_is_zero(r.get()));
  ASSERT_TRUE(
      BN_mod_exp(r.get(), zero.get(), zero.get(), BN_value_one(), ctx()));
  EXPECT_TRUE(BN_is_zero(r.get()));

  ASSERT_TRUE(BN_mod_exp_mont_word(r.get(), 42, zero.get(), BN_value_one(),
                                   ctx(), nullptr));
  EXPECT_TRUE(BN_is_zero(r.get()));
  ASSERT_TRUE(BN_mod_exp_mont_word(r.get(), 0, zero.get(), BN_value_one(),
                                   ctx(), nullptr));
  EXPECT_TRUE(BN_is_zero(r.get()));

  // |BN_mod_exp_mont| and |BN_mod_exp_mont_consttime| require fully-reduced
  // inputs, so a**0 mod 1 is not a valid call. 0**0 mod 1 is valid, however.
  ASSERT_TRUE(BN_mod_exp_mont(r.get(), zero.get(), zero.get(), BN_value_one(),
                              ctx(), nullptr));
  EXPECT_TRUE(BN_is_zero(r.get()));

  ASSERT_TRUE(BN_mod_exp_mont_consttime(r.get(), zero.get(), zero.get(),
                                        BN_value_one(), ctx(), nullptr));
  EXPECT_TRUE(BN_is_zero(r.get()));
}